

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2melody.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string *filename;
  long *plVar4;
  vector<Melody,_std::allocator<Melody>_> melody;
  MidiFile midifile;
  string local_a8;
  MidiFile local_80;
  
  checkOptions(&options,argc,argv);
  filename = smf::Options::getArg_abi_cxx11_(&options,1);
  smf::MidiFile::MidiFile(&local_80,filename);
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"track-count","");
  bVar2 = smf::Options::getBoolean(&options,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (bVar2) {
    iVar3 = smf::MidiFile::getTrackCount(&local_80);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"track","");
    bVar2 = smf::Options::getBoolean(&options,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (!bVar2) {
      smf::MidiFile::joinTracks(&local_80);
    }
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    convertToMelody(&local_80,(vector<Melody,_std::allocator<Melody>_> *)&local_a8);
    qsort(local_a8._M_dataplus._M_p,
          ((long)(local_a8._M_string_length - (long)local_a8._M_dataplus._M_p) >> 3) *
          -0x5555555555555555,0x18,notecompare);
    iVar3 = smf::MidiFile::getTicksPerQuarterNote(&local_80);
    printMelody((vector<Melody,_std::allocator<Melody>_> *)&local_a8,iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  smf::MidiFile::~MidiFile(&local_80);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   checkOptions(options, argc, argv);
   MidiFile midifile(options.getArg(1));
   if (options.getBoolean("track-count")) {
      cout << midifile.getTrackCount() << endl;
      return 0;
   }
   if (!options.getBoolean("track")) {
      midifile.joinTracks();
   } 

   vector<Melody> melody;
   convertToMelody(midifile, melody);
   sortMelody(melody);
   printMelody(melody, midifile.getTicksPerQuarterNote());

   return 0;
}